

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

Vec_Int_t * Gla_ManCollectPPis(Gla_Man_t *p,Vec_Int_t *vPis)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gla_Obj_t *pGVar2;
  Gla_Obj_t *pGVar3;
  int local_38;
  int local_34;
  int k;
  int i;
  Gla_Obj_t *pFanin;
  Gla_Obj_t *pObj;
  Vec_Int_t *vPPis;
  Vec_Int_t *vPis_local;
  Gla_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  if (vPis != (Vec_Int_t *)0x0) {
    Vec_IntClear(vPis);
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vAbs);
    if (iVar1 <= local_34) {
      Vec_IntUniqify(p_00);
      Vec_IntReverseOrder(p_00);
      if (vPis != (Vec_Int_t *)0x0) {
        Vec_IntUniqify(vPis);
      }
      return p_00;
    }
    iVar1 = Vec_IntEntry(p->vAbs,local_34);
    pGVar2 = Gla_ManObj(p,iVar1);
    if ((((*(uint *)&pGVar2->field_0x4 >> 2 & 1) == 0) &&
        ((*(uint *)&pGVar2->field_0x4 >> 5 & 1) == 0)) &&
       ((*(uint *)&pGVar2->field_0x4 >> 7 & 1) == 0)) break;
    for (local_38 = 0; local_38 < (int)(*(uint *)&pGVar2->field_0x4 >> 9); local_38 = local_38 + 1)
    {
      pGVar3 = Gla_ManObj(p,pGVar2->Fanins[local_38]);
      if (((*(uint *)&pGVar3->field_0x4 >> 3 & 1) == 0) && ((*(uint *)&pGVar3->field_0x4 & 1) == 0))
      {
        Vec_IntPush(p_00,pGVar2->Fanins[local_38]);
      }
      else if ((vPis != (Vec_Int_t *)0x0) &&
              (((*(uint *)&pGVar3->field_0x4 >> 3 & 1) != 0 &&
               ((*(uint *)&pGVar3->field_0x4 & 1) == 0)))) {
        Vec_IntPush(vPis,pGVar2->Fanins[local_38]);
      }
    }
    local_34 = local_34 + 1;
  }
  __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                ,0x4dc,"Vec_Int_t *Gla_ManCollectPPis(Gla_Man_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gla_ManCollectPPis( Gla_Man_t * p, Vec_Int_t * vPis )
{
    Vec_Int_t * vPPis;
    Gla_Obj_t * pObj, * pFanin;
    int i, k;
    vPPis = Vec_IntAlloc( 1000 );
    if ( vPis )
        Vec_IntClear( vPis );
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fPi && !pFanin->fAbs )
                Vec_IntPush( vPPis, pObj->Fanins[k] );
            else if ( vPis && pFanin->fPi && !pFanin->fAbs )
                Vec_IntPush( vPis, pObj->Fanins[k] );
    }
    Vec_IntUniqify( vPPis );
    Vec_IntReverseOrder( vPPis );
    if ( vPis )
        Vec_IntUniqify( vPis );
    return vPPis;
}